

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Real Omega_h::get_expected_nelems(Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  Real RVar4;
  double dVar5;
  Reals local_28;
  Real local_18;
  
  local_28.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
      local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28.write_.shared_alloc_.alloc =
           (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_28.write_.shared_alloc_.alloc)->use_count =
           (local_28.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_28.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  RVar4 = get_complexity(mesh,&local_28);
  pAVar3 = local_28.write_.shared_alloc_.alloc;
  if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
      local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_28.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      local_18 = RVar4;
      Alloc::~Alloc(local_28.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      RVar4 = local_18;
    }
  }
  uVar2 = mesh->dim_;
  if (uVar2 < 4) {
    if (uVar2 == 3) {
      dVar5 = 0.0838934100219;
    }
    else {
      dVar5 = *(double *)(&DAT_00457610 + (ulong)(uVar2 == 2) * 8);
    }
    return RVar4 / dVar5;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Real get_expected_nelems(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity(mesh, v2m);
  return get_expected_nelems_from_complexity(complexity, mesh->dim());
}